

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2tt.cpp
# Opt level: O1

json Ps2Tt(json *glyf,double errorBound)

{
  value_t vVar1;
  pointer pbVar2;
  Segment s;
  Segment s_00;
  Segment s_01;
  void *pvVar3;
  Point p0;
  Point p1;
  char cVar4;
  undefined7 uVar5;
  size_type sVar6;
  reference this;
  iterator iVar7;
  bool bVar8;
  reference pbVar9;
  reference pvVar10;
  size_t sVar11;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *piVar12;
  const_reference j;
  ulong uVar13;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value extraout_RDX_01;
  json_value extraout_RDX_02;
  json_value extraout_RDX_03;
  json_value jVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  _Base_ptr __args;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_RSI;
  iterator __begin1_2;
  long lVar16;
  double *pdVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  json jVar23;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  result;
  Solution inflections;
  const_iterator q;
  json quadContour;
  const_iterator beg;
  iterator __begin1_1;
  anon_class_64_2_4710b9f6 advance;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  __end1;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  __begin1;
  iterator __end1_1;
  key_type local_408;
  double local_3e8;
  double dStack_3e0;
  double local_3d8;
  _Base_ptr p_Stack_3d0;
  allocator_type local_3c3;
  allocator_type local_3c2;
  allocator_type local_3c1;
  reference local_3c0;
  double local_3b8;
  _Base_ptr local_3b0;
  undefined1 local_3a8 [8];
  json_value local_3a0;
  undefined1 local_398 [8];
  json_value local_390;
  double *local_388;
  iterator iStack_380;
  double *local_378;
  json *local_370;
  _Base_ptr local_368;
  double local_360;
  double local_358;
  double local_350;
  double local_348;
  _Base_ptr local_340;
  _Base_ptr local_338;
  double local_330;
  double local_328;
  undefined8 uStack_320;
  undefined1 local_310 [8];
  json_value local_308;
  string_type *local_300;
  double local_2f8;
  undefined8 uStack_2f0;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_2e8;
  undefined1 local_2c8 [16];
  double local_2b8;
  _Base_ptr p_Stack_2b0;
  double local_2a8;
  _Base_ptr p_Stack_2a0;
  double local_298;
  _Base_ptr p_Stack_290;
  double local_288;
  _Base_ptr p_Stack_280;
  double local_278;
  double local_270;
  double local_268;
  _Base_ptr p_Stack_260;
  double local_258;
  _Base_ptr p_Stack_250;
  double local_248;
  _Base_ptr p_Stack_240;
  double local_238;
  _Base_ptr p_Stack_230;
  double local_228;
  _Base_ptr p_Stack_220;
  double local_218;
  _Base_ptr p_Stack_210;
  _Base_ptr local_208;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbStack_200;
  double local_1f8;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_1f0;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_1d0;
  const_iterator local_1b0;
  iterator local_190;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_170;
  pointer local_150;
  _Base_ptr local_148;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbStack_140;
  double local_138;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  local_130;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  local_c0;
  iterator local_50;
  
  glyf->m_type = null;
  (glyf->m_value).object = (object_t *)0x0;
  local_350 = errorBound;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(glyf);
  local_370 = glyf;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(glyf);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::cbegin(&local_130.anchor,in_RSI);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ::iteration_proxy_value(&local_c0,&local_130.anchor);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::cend((const_iterator *)&local_408,in_RSI);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ::iteration_proxy_value
            (&local_130,
             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)&local_408);
  while( true ) {
    paVar15 = &local_408.field_2;
    bVar8 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==(&local_c0.anchor,&local_130.anchor);
    if (bVar8) break;
    local_300 = nlohmann::detail::
                iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                ::key(&local_c0);
    pbVar9 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator*(&local_c0.anchor);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_3a8,pbVar9);
    local_408._M_dataplus._M_p._0_1_ = (char)paVar15;
    cVar4 = (char)local_408._M_dataplus._M_p;
    local_408._M_dataplus._M_p._1_7_ = (undefined7)((ulong)paVar15 >> 8);
    uVar5 = local_408._M_dataplus._M_p._1_7_;
    local_408._M_string_length = 5;
    local_408.field_2._M_allocated_capacity._0_6_ = 0x486d657473;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::erase((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_3a8,&local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_408._M_dataplus._M_p._1_7_,(char)local_408._M_dataplus._M_p) != paVar15) {
      operator_delete((undefined1 *)
                      CONCAT71(local_408._M_dataplus._M_p._1_7_,(char)local_408._M_dataplus._M_p),
                      local_408.field_2._M_allocated_capacity + 1);
    }
    local_408._M_string_length = 5;
    local_408.field_2._M_allocated_capacity._0_6_ = 0x566d657473;
    local_408._M_dataplus._M_p._0_1_ = cVar4;
    local_408._M_dataplus._M_p._1_7_ = uVar5;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::erase((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_3a8,&local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_408._M_dataplus._M_p._1_7_,(char)local_408._M_dataplus._M_p) != paVar15) {
      operator_delete((undefined1 *)
                      CONCAT71(local_408._M_dataplus._M_p._1_7_,(char)local_408._M_dataplus._M_p),
                      local_408.field_2._M_allocated_capacity + 1);
    }
    local_408.field_2._M_allocated_capacity = 0x6b73614d746e6968;
    local_408._M_string_length = 9;
    local_408.field_2._8_2_ = 0x73;
    local_408._M_dataplus._M_p._0_1_ = cVar4;
    local_408._M_dataplus._M_p._1_7_ = uVar5;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::erase((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_3a8,&local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_408._M_dataplus._M_p._1_7_,(char)local_408._M_dataplus._M_p) != paVar15) {
      operator_delete((undefined1 *)
                      CONCAT71(local_408._M_dataplus._M_p._1_7_,(char)local_408._M_dataplus._M_p),
                      local_408.field_2._M_allocated_capacity + 1);
    }
    local_408.field_2._M_allocated_capacity = 0x4d72756f746e6f63;
    local_408._M_string_length = 0xc;
    local_408.field_2._8_5_ = 0x736b7361;
    local_408._M_dataplus._M_p._0_1_ = cVar4;
    local_408._M_dataplus._M_p._1_7_ = uVar5;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::erase((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_3a8,&local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_408._M_dataplus._M_p._1_7_,(char)local_408._M_dataplus._M_p) != paVar15) {
      operator_delete((undefined1 *)
                      CONCAT71(local_408._M_dataplus._M_p._1_7_,(char)local_408._M_dataplus._M_p),
                      (ulong)(local_408.field_2._M_allocated_capacity + 1));
    }
    pvVar10 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)local_3a8,"contours");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::begin(&local_190,pvVar10);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end(&local_50,pvVar10);
    bVar8 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==(&local_190,&local_50);
    while (!bVar8) {
      local_3c0 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator*(&local_190);
      vVar1 = local_3c0->m_type;
      sVar11 = (size_t)vVar1;
      if (vVar1 != null) {
        if (vVar1 == object) {
          sVar11 = (((local_3c0->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count
          ;
        }
        else if (vVar1 == array) {
          sVar11 = (long)(((local_3c0->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(((local_3c0->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4;
        }
        else {
          sVar11 = 1;
        }
      }
      if (1 < sVar11) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_2c8,(initializer_list_t)ZEXT816(0),false,array);
        this = local_3c0;
        local_218 = 0.0;
        p_Stack_210 = (_Base_ptr)0x0;
        local_228 = 0.0;
        p_Stack_220 = (_Base_ptr)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::cbegin(&local_1b0,local_3c0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::cend((const_iterator *)&local_408,this);
        piVar12 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator--((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                *)&local_408);
        pbVar2 = piVar12->m_object;
        local_1f8 = (double)(piVar12->m_it).primitive_iterator.m_it;
        local_208 = (piVar12->m_it).object_iterator._M_node;
        pbStack_200 = (piVar12->m_it).array_iterator._M_current;
        vVar1 = this->m_type;
        uVar18 = (ulong)vVar1;
        if (vVar1 != null) {
          if (vVar1 == object) {
            uVar18 = (((local_3c0->m_value).object)->_M_t)._M_impl.super__Rb_tree_header.
                     _M_node_count;
          }
          else if (vVar1 == array) {
            uVar18 = (long)(((local_3c0->m_value).array)->
                           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(((local_3c0->m_value).array)->
                           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 4;
          }
          else {
            uVar18 = 1;
          }
        }
        local_2e8.m_object = local_1b0.m_object;
        local_2e8.m_it.primitive_iterator.m_it = local_1b0.m_it.primitive_iterator.m_it;
        local_2e8.m_it.object_iterator._M_node = local_1b0.m_it.object_iterator._M_node;
        local_2e8.m_it.array_iterator._M_current = local_1b0.m_it.array_iterator._M_current;
        pbVar9 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*(&local_2e8);
        Point::Point((Point *)&local_408,pbVar9);
        local_3b8 = (double)CONCAT71(local_408._M_dataplus._M_p._1_7_,
                                     (char)local_408._M_dataplus._M_p);
        p0.x._1_7_ = local_408._M_dataplus._M_p._1_7_;
        p0.x._0_1_ = (char)local_408._M_dataplus._M_p;
        p0.y = (double)local_408._M_string_length;
        local_3b0 = (_Base_ptr)local_408._M_string_length;
        ConstructTtPath::Move((ConstructTtPath *)local_2c8,pbVar9,p0);
        local_150 = pbVar2;
        local_138 = local_1f8;
        local_148 = local_208;
        pbStack_140 = pbStack_200;
        for (; uVar18 != 0; uVar18 = uVar18 + lVar16) {
          local_1d0.m_object = local_2e8.m_object;
          local_1d0.m_it.object_iterator._M_node = local_2e8.m_it.object_iterator._M_node;
          local_1d0.m_it.array_iterator._M_current = local_2e8.m_it.array_iterator._M_current;
          local_1d0.m_it.primitive_iterator.m_it = local_2e8.m_it.primitive_iterator.m_it;
          bVar8 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator==(&local_1d0,&local_170);
          if (bVar8) {
            local_408._M_dataplus._M_p._0_1_ = (char)local_150;
            local_408._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_150 >> 8);
            local_408.field_2._8_8_ = local_138;
            local_408._M_string_length = (size_type)local_148;
            local_408.field_2._M_allocated_capacity = (size_type)pbStack_140;
          }
          else {
            local_408._M_dataplus._M_p._0_1_ = (char)local_1d0.m_object;
            local_408._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_1d0.m_object >> 8);
            local_408.field_2._8_8_ = local_1d0.m_it.primitive_iterator.m_it;
            local_408._M_string_length = (size_type)local_1d0.m_it.object_iterator._M_node;
            local_408.field_2._M_allocated_capacity =
                 (size_type)local_1d0.m_it.array_iterator._M_current;
            nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator+=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&local_408,-1);
          }
          local_2e8.m_object =
               (pointer)CONCAT71(local_408._M_dataplus._M_p._1_7_,(char)local_408._M_dataplus._M_p);
          local_2e8.m_it.primitive_iterator.m_it = local_408.field_2._8_8_;
          local_2e8.m_it.object_iterator._M_node = (_Base_ptr)local_408._M_string_length;
          local_2e8.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_408.field_2._M_allocated_capacity;
          pbVar9 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::operator*(&local_2e8);
          j = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)pbVar9,"on");
          nlohmann::detail::
          from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                    (j,(boolean_t *)&local_408);
          if ((char)local_408._M_dataplus._M_p == '\x01') {
            pbVar9 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*(&local_2e8);
            Point::Point((Point *)&local_408,pbVar9);
            local_360 = (double)CONCAT71(local_408._M_dataplus._M_p._1_7_,
                                         (char)local_408._M_dataplus._M_p);
            p1.x._1_7_ = local_408._M_dataplus._M_p._1_7_;
            p1.x._0_1_ = (char)local_408._M_dataplus._M_p;
            p1.y = (double)local_408._M_string_length;
            lVar16 = -1;
            local_368 = (_Base_ptr)local_408._M_string_length;
            ConstructTtPath::Line((ConstructTtPath *)local_2c8,pbVar9,p1);
          }
          else {
            pbVar9 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*(&local_2e8);
            Point::Point((Point *)&local_408,pbVar9);
            local_218 = (double)CONCAT71(local_408._M_dataplus._M_p._1_7_,
                                         (char)local_408._M_dataplus._M_p);
            p_Stack_210 = (_Base_ptr)local_408._M_string_length;
            nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator--(&local_2e8);
            pbVar9 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*(&local_2e8);
            Point::Point((Point *)&local_408,pbVar9);
            local_228 = (double)CONCAT71(local_408._M_dataplus._M_p._1_7_,
                                         (char)local_408._M_dataplus._M_p);
            p_Stack_220 = (_Base_ptr)local_408._M_string_length;
            local_1f0.m_object = local_2e8.m_object;
            local_1f0.m_it.primitive_iterator.m_it = local_2e8.m_it.primitive_iterator.m_it;
            local_1f0.m_it.object_iterator._M_node = local_2e8.m_it.object_iterator._M_node;
            local_1f0.m_it.array_iterator._M_current = local_2e8.m_it.array_iterator._M_current;
            bVar8 = nlohmann::detail::
                    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    ::operator==(&local_1f0,&local_170);
            if (bVar8) {
              local_408._M_dataplus._M_p._0_1_ = (char)local_150;
              local_408._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_150 >> 8);
              local_408.field_2._8_8_ = local_138;
              local_408._M_string_length = (size_type)local_148;
              local_408.field_2._M_allocated_capacity = (size_type)pbStack_140;
            }
            else {
              local_408._M_dataplus._M_p._0_1_ = (char)local_1f0.m_object;
              local_408._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_1f0.m_object >> 8);
              local_408.field_2._8_8_ = local_1f0.m_it.primitive_iterator.m_it;
              local_408._M_string_length = (size_type)local_1f0.m_it.object_iterator._M_node;
              local_408.field_2._M_allocated_capacity =
                   (size_type)local_1f0.m_it.array_iterator._M_current;
              nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator+=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&local_408,-1);
            }
            local_2e8.m_object =
                 (pointer)CONCAT71(local_408._M_dataplus._M_p._1_7_,(char)local_408._M_dataplus._M_p
                                  );
            local_2e8.m_it.primitive_iterator.m_it = local_408.field_2._8_8_;
            local_2e8.m_it.object_iterator._M_node = (_Base_ptr)local_408._M_string_length;
            local_2e8.m_it.array_iterator._M_current =
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_408.field_2._M_allocated_capacity;
            pbVar9 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*(&local_2e8);
            Point::Point((Point *)&local_408,pbVar9);
            local_360 = (double)CONCAT71(local_408._M_dataplus._M_p._1_7_,
                                         (char)local_408._M_dataplus._M_p);
            local_258 = local_218;
            p_Stack_250 = p_Stack_210;
            local_248 = local_228;
            p_Stack_240 = p_Stack_220;
            local_268 = local_3b8;
            p_Stack_260 = local_3b0;
            p_Stack_230 = (_Base_ptr)local_408._M_string_length;
            dVar19 = (double)p_Stack_220 * -3.0;
            dVar22 = ((((double)p_Stack_210 - ((double)p_Stack_220 + (double)p_Stack_220)) +
                      (double)local_408._M_string_length) * local_3b8 +
                     (((double)p_Stack_210 * -3.0 + (double)local_3b0 + (double)local_3b0 +
                      (double)local_408._M_string_length) * local_228 -
                     (((double)local_3b0 - ((double)p_Stack_210 + (double)p_Stack_210)) +
                     (double)p_Stack_220) * local_360)) -
                     ((double)local_408._M_string_length + (double)local_408._M_string_length +
                     dVar19 + (double)local_3b0) * local_218;
            local_368 = (_Base_ptr)local_408._M_string_length;
            dVar21 = (((double)local_3b0 + (double)local_3b0 + dVar19 +
                      (double)local_408._M_string_length) * local_218 +
                     local_360 * ((double)local_3b0 - (double)p_Stack_210) +
                     ((double)p_Stack_210 - (double)local_3b0) * local_228 * 3.0) -
                     (dVar19 + (double)p_Stack_210 + (double)p_Stack_210 +
                     (double)local_408._M_string_length) * local_3b8;
            local_340 = p_Stack_210;
            local_330 = local_228;
            local_338 = p_Stack_220;
            local_348 = local_218;
            dVar19 = ((double)p_Stack_220 - (double)local_3b0) * local_218 +
                     ((double)local_3b0 - (double)p_Stack_210) * local_228 +
                     ((double)p_Stack_210 - (double)p_Stack_220) * local_3b8;
            local_238 = local_360;
            if ((dVar22 != 0.0) || (NAN(dVar22))) {
              local_328 = dVar21 * dVar21 + dVar19 * dVar22 * -4.0;
              uStack_320 = 0;
              if (local_328 <= 0.0) {
                if ((local_328 != 0.0) || (NAN(local_328))) {
                  local_270 = -dVar21 / (dVar22 + dVar22);
                  __l_01._M_len = 1;
                  __l_01._M_array = &local_270;
                  std::vector<double,_std::allocator<double>_>::vector
                            ((vector<double,_std::allocator<double>_> *)&local_408,__l_01,&local_3c3
                            );
                }
                else {
                  local_408._M_dataplus._M_p._0_1_ = '\0';
                  local_408._M_dataplus._M_p._1_7_ = 0;
                  local_408._M_string_length = 0;
                  local_408.field_2._M_allocated_capacity = 0;
                }
              }
              else {
                dVar19 = SQRT(local_328);
                uStack_2f0 = 0;
                dVar20 = dVar19;
                local_2f8 = dVar21;
                if (local_328 < 0.0) {
                  local_358 = dVar22;
                  local_278 = dVar19;
                  dVar19 = sqrt(local_328);
                  dVar20 = local_278;
                  dVar22 = local_358;
                }
                dVar22 = dVar22 + dVar22;
                local_2b8 = (-local_2f8 - dVar19) / dVar22;
                if (local_328 < 0.0) {
                  local_358 = dVar22;
                  dVar20 = sqrt(local_328);
                  dVar22 = local_358;
                }
                p_Stack_2b0 = (_Base_ptr)((dVar20 - local_2f8) / dVar22);
                __l._M_len = 2;
                __l._M_array = &local_2b8;
                std::vector<double,_std::allocator<double>_>::vector
                          ((vector<double,_std::allocator<double>_> *)&local_408,__l,&local_3c2);
              }
            }
            else if ((dVar21 != 0.0) || (NAN(dVar21))) {
              local_2b8 = -dVar19 / dVar21;
              uStack_2f0 = 0;
              __l_00._M_len = 1;
              __l_00._M_array = &local_2b8;
              local_2f8 = dVar21;
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)&local_408,__l_00,&local_3c1);
            }
            else {
              local_408._M_dataplus._M_p._0_1_ = '\0';
              local_408._M_dataplus._M_p._1_7_ = 0;
              local_408._M_string_length = 0;
              local_408.field_2._M_allocated_capacity = 0;
            }
            sVar6 = local_408._M_string_length;
            local_388 = (double *)0x0;
            iStack_380._M_current = (double *)0x0;
            local_378 = (double *)0x0;
            for (__args = (_Base_ptr)
                          CONCAT71(local_408._M_dataplus._M_p._1_7_,(char)local_408._M_dataplus._M_p
                                  ); iVar7._M_current = iStack_380._M_current, pdVar17 = local_388,
                __args != (_Base_ptr)sVar6; __args = (_Base_ptr)&__args->_M_parent) {
              dVar19 = *(double *)__args;
              if ((1e-06 < dVar19) && (dVar19 < 0.999999)) {
                if (iStack_380._M_current == local_378) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&local_388,iStack_380,
                             (double *)__args);
                }
                else {
                  *iStack_380._M_current = dVar19;
                  iStack_380._M_current = iStack_380._M_current + 1;
                }
              }
            }
            if (local_388 != iStack_380._M_current) {
              uVar13 = (long)iStack_380._M_current - (long)local_388 >> 3;
              lVar16 = 0x3f;
              if (uVar13 != 0) {
                for (; uVar13 >> lVar16 == 0; lVar16 = lVar16 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_388,iStack_380._M_current,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (pdVar17,iVar7._M_current);
            }
            pvVar3 = (void *)CONCAT71(local_408._M_dataplus._M_p._1_7_,
                                      (char)local_408._M_dataplus._M_p);
            if (pvVar3 != (void *)0x0) {
              operator_delete(pvVar3,local_408.field_2._M_allocated_capacity - (long)pvVar3);
            }
            iVar7._M_current = iStack_380._M_current;
            if (iStack_380._M_current == local_388) {
              s_01._M_elems[0].y = (double)p_Stack_260;
              s_01._M_elems[0].x = local_268;
              s_01._M_elems[1].x = local_258;
              s_01._M_elems[1].y = (double)p_Stack_250;
              s_01._M_elems[2].x = local_248;
              s_01._M_elems[2].y = (double)p_Stack_240;
              s_01._M_elems[3].x = local_238;
              s_01._M_elems[3].y = (double)p_Stack_230;
              ApproximateSimpleSegment
                        (s_01,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                               *)local_2c8,local_350);
            }
            else {
              local_328 = 0.0;
              pdVar17 = local_388;
              do {
                dVar19 = 1.0 - local_328;
                local_328 = *pdVar17;
                local_408._M_dataplus._M_p._0_1_ = SUB81(local_3b8,0);
                local_408._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_3b8 >> 8);
                local_408._M_string_length = (size_type)local_3b0;
                dVar20 = 1.0 - (1.0 - local_328) / dVar19;
                dVar19 = 1.0 - dVar20;
                local_408.field_2._M_allocated_capacity =
                     (size_type)(local_348 * dVar20 + local_3b8 * dVar19);
                local_408.field_2._8_8_ = (double)local_340 * dVar20 + (double)local_3b0 * dVar19;
                dVar22 = local_330 * dVar20 + local_348 * dVar19;
                dVar21 = (double)local_338 * dVar20 + (double)local_340 * dVar19;
                local_330 = local_360 * dVar20 + local_330 * dVar19;
                local_338 = (_Base_ptr)((double)local_368 * dVar20 + (double)local_338 * dVar19);
                local_3e8 = dVar20 * dVar22 +
                            dVar19 * (double)local_408.field_2._M_allocated_capacity;
                dStack_3e0 = dVar20 * dVar21 + dVar19 * (double)local_408.field_2._8_8_;
                local_348 = dVar20 * local_330 + dVar22 * dVar19;
                local_340 = (_Base_ptr)(dVar20 * (double)local_338 + dVar21 * dVar19);
                local_3d8 = dVar20 * local_348 + dVar19 * local_3e8;
                p_Stack_3d0 = (_Base_ptr)(dVar20 * (double)local_340 + dVar19 * dStack_3e0);
                s._M_elems[0].y = (double)local_3b0;
                s._M_elems[0].x = local_3b8;
                s._M_elems[1].x = (double)local_408.field_2._M_allocated_capacity;
                s._M_elems[1].y = (double)local_408.field_2._8_8_;
                s._M_elems[2].x = local_3e8;
                s._M_elems[2].y = dStack_3e0;
                s._M_elems[3].x = local_3d8;
                s._M_elems[3].y = (double)p_Stack_3d0;
                local_3b8 = local_3d8;
                local_3b0 = p_Stack_3d0;
                ApproximateSimpleSegment
                          (s,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_2c8,local_350);
                pdVar17 = pdVar17 + 1;
              } while (pdVar17 != iVar7._M_current);
              local_2b8 = local_3b8;
              p_Stack_2b0 = local_3b0;
              local_2a8 = local_348;
              p_Stack_2a0 = local_340;
              local_298 = local_330;
              p_Stack_290 = local_338;
              local_288 = local_360;
              p_Stack_280 = local_368;
              s_00._M_elems[0].y = (double)local_3b0;
              s_00._M_elems[0].x = local_3b8;
              s_00._M_elems[1].x = local_348;
              s_00._M_elems[1].y = (double)local_340;
              s_00._M_elems[2].x = local_330;
              s_00._M_elems[2].y = (double)local_338;
              s_00._M_elems[3].x = local_360;
              s_00._M_elems[3].y = (double)local_368;
              ApproximateSimpleSegment
                        (s_00,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                               *)local_2c8,local_350);
            }
            if (local_388 != (double *)0x0) {
              operator_delete(local_388,(long)local_378 - (long)local_388);
            }
            lVar16 = -3;
          }
          local_3b8 = local_360;
          local_3b0 = local_368;
        }
        ConstructTtPath::Finish
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_2c8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_310,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_2c8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_310);
        vVar1 = local_3c0->m_type;
        local_3c0->m_type = local_310[0];
        jVar14 = local_3c0->m_value;
        local_3c0->m_value = local_308;
        local_310[0] = vVar1;
        local_308 = jVar14;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant(local_3c0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_310);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_310 + 8),local_310[0]);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_2c8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_2c8 + 8),local_2c8[0]);
      }
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(&local_190);
      bVar8 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==(&local_190,&local_50);
    }
    local_398[0] = local_3a8[0];
    local_390 = local_3a0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_3a8);
    local_3a8[0] = null;
    local_3a0.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_398);
    pvVar10 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](local_370,local_300);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_398);
    vVar1 = pvVar10->m_type;
    pvVar10->m_type = local_398[0];
    jVar14 = pvVar10->m_value;
    pvVar10->m_value = local_390;
    local_398[0] = vVar1;
    local_390 = jVar14;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant(pvVar10);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_398);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_398 + 8),local_398[0]);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_3a8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_3a8 + 8),local_3a8[0]);
    pvVar10 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](local_370,local_300);
    RoundInPlace(pvVar10);
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++(&local_c0.anchor);
    local_c0.array_index = local_c0.array_index + 1;
  }
  jVar14 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.empty_str._M_dataplus._M_p != &local_130.empty_str.field_2) {
    operator_delete(local_130.empty_str._M_dataplus._M_p,
                    local_130.empty_str.field_2._M_allocated_capacity + 1);
    jVar14 = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.array_index_str._M_dataplus._M_p != &local_130.array_index_str.field_2) {
    operator_delete(local_130.array_index_str._M_dataplus._M_p,
                    local_130.array_index_str.field_2._M_allocated_capacity + 1);
    jVar14 = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.empty_str._M_dataplus._M_p != &local_c0.empty_str.field_2) {
    operator_delete(local_c0.empty_str._M_dataplus._M_p,
                    local_c0.empty_str.field_2._M_allocated_capacity + 1);
    jVar14 = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.array_index_str._M_dataplus._M_p != &local_c0.array_index_str.field_2) {
    operator_delete(local_c0.array_index_str._M_dataplus._M_p,
                    local_c0.array_index_str.field_2._M_allocated_capacity + 1);
    jVar14 = extraout_RDX_03;
  }
  jVar23.m_value.string = jVar14.string;
  jVar23._0_8_ = local_370;
  return jVar23;
}

Assistant:

json Ps2Tt(const json &glyf, double errorBound)
{
	json glyfQuad;
	for (const auto &[name, glyph] : glyf.items())
	{
		glyfQuad[name] = Convert(glyph, errorBound);
		RoundInPlace(glyfQuad[name]);
	}
	return glyfQuad;
}